

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

pair<signed_char,_short> __thiscall node::getFromSrc(node *this,string *src)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  arrowType *paVar7;
  uint uVar8;
  
  lVar3 = std::__cxx11::string::find_first_not_of((char *)src,0x10e194);
  if (lVar3 == -1) {
    uVar5 = atoi((src->_M_dataplus)._M_p);
LAB_0010afa9:
    uVar8 = 1;
    goto LAB_0010b0e5;
  }
  bVar1 = std::operator==(src,"ANY");
  if (bVar1) {
    uVar5 = 3;
    iVar6 = 0x40000000;
    do {
      if (uVar5 == 7) {
        uVar8 = 0;
        goto switchD_0010afe1_caseD_5;
      }
      uVar4 = (iVar6 >> 0x1f) + (uVar5 & 3);
      uVar8 = -uVar4;
      if (0 < (int)uVar4) {
        uVar8 = uVar4;
      }
      iVar2 = (*this->arrows[uVar8]->_vptr_arrowType[1])
                        (this->arrows[uVar8],(ulong)(uint)(int)(char)this->nodeId);
      uVar5 = uVar5 + 1;
      iVar6 = iVar6 + 0x40000000;
    } while ((char)iVar2 == '\0');
    uVar5 = (*this->arrows[uVar8]->_vptr_arrowType[2])
                      (this->arrows[uVar8],(ulong)(uint)(int)(char)this->nodeId);
    goto LAB_0010afa9;
  }
  bVar1 = std::operator==(src,"LAST");
  uVar8 = 1;
  if (bVar1) {
    switch(this->last) {
    case '\0':
      break;
    case '\x01':
      break;
    case '\x02':
      break;
    case '\x03':
      break;
    default:
      goto switchD_0010afe1_caseD_4;
    case '\x05':
      goto switchD_0010afe1_caseD_5;
    }
    std::__cxx11::string::assign((char *)src);
  }
switchD_0010afe1_caseD_4:
  bVar1 = std::operator==(src,"ACC");
  if (bVar1) {
    uVar5 = (uint)(ushort)this->acc;
  }
  else {
    bVar1 = std::operator==(src,"NIL");
    if (bVar1) {
switchD_0010afe1_caseD_5:
      uVar5 = 0;
    }
    else {
      bVar1 = std::operator==(src,"LEFT");
      if (bVar1) {
        paVar7 = this->arrows[3];
      }
      else {
        bVar1 = std::operator==(src,"RIGHT");
        if (bVar1) {
          paVar7 = this->arrows[1];
        }
        else {
          bVar1 = std::operator==(src,"UP");
          if (bVar1) {
            paVar7 = this->arrows[0];
          }
          else {
            std::operator==(src,"DOWN");
            paVar7 = this->arrows[2];
          }
        }
      }
      iVar6 = (*paVar7->_vptr_arrowType[1])(paVar7,(ulong)(uint)(int)(char)this->nodeId);
      uVar5 = 0;
      bVar1 = (char)iVar6 != '\0';
      if (bVar1) {
        uVar5 = (*paVar7->_vptr_arrowType[2])(paVar7,(ulong)(uint)(int)(char)this->nodeId);
      }
      uVar8 = (uint)bVar1;
      (*paVar7->_vptr_arrowType[5])(paVar7);
    }
  }
LAB_0010b0e5:
  return (pair<signed_char,_short>)(uVar5 << 0x10 | uVar8);
}

Assistant:

pair<int8_t, int16_t> node::getFromSrc(string src) {
  if(src.find_first_not_of("0123456789") == std::string::npos) {
    // Then src is just a number
    pair<bool, int16_t> p;
    p.first = READY;
    try{
      p.second = atoi(src.c_str());
    }
    catch(...){
      p.first = INVALID;
      return p;
    }
    return p;
  } else {
    if(src=="ANY"){
      pair<bool, int16_t> p;
      for(int i=0;i<4;i++){
	int num=abs((i+3)%4-(int)floor((i+1)/2)%2);            //Ask Tyler
	if (arrows[num]->getRequest(nodeId)){
	  p.first = true;
	  p.second = arrows[num]->nodeGet(nodeId);
	  return p;
	}
      }
      p.first=false;
      return p;
    }
    if(src=="LAST"){
      if(last==5){
	pair<bool, int16_t> p;
	p.first=true;
	p.second=0;
	return p;
      }
      else{
	if(last==0)
	  src="UP";
	else if(last==1)
	  src="RIGHT";
	else if(last==2)
	  src="DOWN";
	else if(last==3)
	  src="LEFT";
      }
    }
    if(src == "ACC") {
      pair<bool, int16_t> p;
      p.first = true;
      p.second = this->acc;
      return p;
    } else if (src ==  "NIL") {
      pair<bool, int16_t> p;
      p.first = true;
      p.second = 0;
      return p;
    } else if (src ==  "LEFT") {
      arrowType *a = arrows[3];
      pair<bool, int16_t> p;

      if (a->getRequest(nodeId)) {
        p.first = true;
        p.second = a->nodeGet(nodeId);
      } else {
        p.first = false;
      }
      a->updateValues();
      return p;
    } else if (src ==  "RIGHT") {
    	arrowType *a = arrows[1];
      pair<bool, int16_t> p;

      if (a->getRequest(nodeId)) {
        p.first = true;
        p.second = a->nodeGet(nodeId);
      } else {
        p.first = false;
      }
      a->updateValues();
      return p;
    } else if (src ==  "UP") {
    	arrowType *a = arrows[0];
	pair<bool, int16_t> p;

      if (a->getRequest(nodeId)){
        p.first = true;
        p.second = a->nodeGet(nodeId);
      } else {
        p.first = false;
      }
      a->updateValues();
      return p;
    } else if (src ==  "DOWN") {
    	arrowType *a = arrows[2];
      pair<bool, int16_t> p;

      if (a->getRequest(nodeId)) {
        p.first = true;
        p.second = a->nodeGet(nodeId);
      } else {
        p.first = false;
      }
      a->updateValues();
      return p;
    }
  }
  // ANY and LAST are for the future (hopefully not)
}